

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_core.cpp
# Opt level: O3

void QTest::qSleep(milliseconds msecs)

{
  int iVar1;
  int *piVar2;
  long in_FS_OFFSET;
  timespec local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < msecs.__r) {
    local_20.tv_sec = (ulong)msecs.__r / 1000;
    local_20.tv_nsec = ((ulong)msecs.__r % 1000) * 1000000;
    do {
      iVar1 = nanosleep(&local_20,&local_20);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTest::qSleep(std::chrono::milliseconds msecs)
{
    Q_ASSERT(msecs > 0ms);
    std::this_thread::sleep_for(msecs);
}